

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall toml::detail::location::location(location *this,string *source_name,string *cont)

{
  element_type *this_00;
  const_iterator cVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> local_30;
  string *local_20;
  string *cont_local;
  string *source_name_local;
  location *this_local;
  
  local_20 = cont;
  cont_local = source_name;
  source_name_local = (string *)this;
  region_base::region_base(&this->super_region_base);
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__location_003f62d8;
  local_38._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::
  make_shared<std::vector<char,std::allocator<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_30,&local_38);
  std::shared_ptr<std::vector<char,std::allocator<char>>const>::
  shared_ptr<std::vector<char,std::allocator<char>>,void>
            ((shared_ptr<std::vector<char,std::allocator<char>>const> *)&this->source_,&local_30);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr(&local_30);
  this->line_number_ = 1;
  std::__cxx11::string::string((string *)&this->source_name_,(string *)source_name);
  this_00 = std::
            __shared_ptr_access<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->source_);
  cVar1 = std::vector<char,_std::allocator<char>_>::cbegin(this_00);
  (this->iter_)._M_current = cVar1._M_current;
  return;
}

Assistant:

location(std::string source_name, const std::string& cont)
      : source_(std::make_shared<std::vector<char>>(cont.begin(), cont.end())),
        line_number_(1), source_name_(std::move(source_name)), iter_(source_->cbegin())
    {}